

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

bool djgp_push_string(djg_program *program,char *str,...)

{
  char in_AL;
  uint uVar1;
  size_t sVar2;
  char *__s;
  djg_program *pdVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  djg_program *pdVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (program != (djg_program *)0x0) {
    sVar2 = strlen(str);
    if (sVar2 < 0x1000) {
      __s = (char *)malloc(0x1000);
      local_f8 = 0x3000000010;
      local_f0 = &vl[0].overflow_arg_area;
      local_e8 = local_d8;
      uVar1 = vsnprintf(__s,0x1000,str,&local_f8);
      if (uVar1 < 0x1001) {
        do {
          pdVar4 = program;
          program = pdVar4->next;
        } while (program != (djg_program *)0x0);
        pdVar3 = (djg_program *)calloc(1,0x10);
        pdVar4->next = pdVar3;
        pdVar3->src = __s;
      }
      else {
        fwrite("djg_error: string too long\n",0x1b,1,_stdout);
        fflush(_stdout);
      }
      return uVar1 < 0x1001;
    }
    __assert_fail("strlen(str) < 4096",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                  ,0x1df,"bool djgp_push_string(djg_program *, const char *, ...)");
  }
  __assert_fail("program",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                ,0x1de,"bool djgp_push_string(djg_program *, const char *, ...)");
}

Assistant:

DJGDEF bool djgp_push_string(djg_program *program, const char *str, ...)
{
    char *buf;
    va_list vl;
    int n;

    DJG_ASSERT(program);
    DJG_ASSERT(strlen(str) < DJG__CHAR_BUFFER_SIZE);
    buf = (char *)DJG_MALLOC(sizeof(char) * DJG__CHAR_BUFFER_SIZE);
    va_start(vl, str);
    n = vsnprintf(buf, DJG__CHAR_BUFFER_SIZE, str, vl);
    va_end(vl);
    if (n < 0 || n > DJG__CHAR_BUFFER_SIZE) {
        DJG_LOG("djg_error: string too long\n");
        return false;
    }

    return djgp__push_src(program, buf);
}